

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

GCstr * lj_str_rehash_chain(lua_State *L,StrHash hashc,char *str,MSize len)

{
  uint uVar1;
  global_State *g_00;
  GCRef *pGVar2;
  uintptr_t uVar3;
  ulong uVar4;
  byte bVar5;
  GCstr *pGVar6;
  uint local_6c;
  StrHash hash;
  GCstr *s;
  GCobj *next;
  uintptr_t u;
  GCobj *o;
  MSize strmask;
  GCRef *strtab;
  int ow;
  global_State *g;
  MSize len_local;
  char *str_local;
  StrHash hashc_local;
  lua_State *L_local;
  
  g_00 = (global_State *)(L->glref).ptr64;
  if ((g_00->gc).state == '\x03') {
    bVar5 = (g_00->gc).currentwhite ^ 3;
  }
  else {
    bVar5 = 0;
  }
  pGVar2 = (g_00->str).tab;
  uVar1 = (g_00->str).mask;
  u = pGVar2[hashc & uVar1].gcptr64;
  pGVar2[hashc & uVar1].gcptr64 = 1;
  (g_00->str).second = '\x01';
  do {
    while( true ) {
      if (u == 0) {
        pGVar6 = lj_str_new(L,str,(ulong)len);
        return pGVar6;
      }
      uVar3 = *(uintptr_t *)u;
      if (bVar5 != 0) break;
LAB_00114900:
      local_6c = *(StrHash *)(u + 0x10);
      if (*(char *)(u + 0xb) == '\0') {
        local_6c = (*hash_dense)((g_00->str).seed,local_6c,(char *)(u + 0x18),*(MSize *)(u + 0x14));
        *(uint *)(u + 0x10) = local_6c;
        *(undefined1 *)(u + 0xb) = 1;
      }
      uVar4 = pGVar2[uVar1 & local_6c].gcptr64;
      *(ulong *)u = uVar4 & 0xfffffffffffffffe;
      pGVar2[uVar1 & local_6c].gcptr64 = u | uVar4 & 1;
      u = uVar3;
    }
    if (((*(byte *)(u + 8) ^ 3) & bVar5) != 0) {
      *(byte *)(u + 8) = *(byte *)(u + 8) & 0xf8 | (g_00->gc).currentwhite & 3;
      goto LAB_00114900;
    }
    lj_str_free(g_00,(GCstr *)u);
    u = uVar3;
  } while( true );
}

Assistant:

static LJ_NOINLINE GCstr *lj_str_rehash_chain(lua_State *L, StrHash hashc,
					      const char *str, MSize len)
{
  global_State *g = G(L);
  int ow = g->gc.state == GCSsweepstring ? otherwhite(g) : 0;  /* Sweeping? */
  GCRef *strtab = g->str.tab;
  MSize strmask = g->str.mask;
  GCobj *o = gcref(strtab[hashc & strmask]);
  setgcrefp(strtab[hashc & strmask], (void *)((uintptr_t)1));
  g->str.second = 1;
  while (o) {
    uintptr_t u;
    GCobj *next = gcnext(o);
    GCstr *s = gco2str(o);
    StrHash hash;
    if (ow) {  /* Must sweep while rechaining. */
      if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* String alive? */
	lj_assertG(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED),
		   "sweep of undead string");
	makewhite(g, o);
      } else {  /* Free dead string. */
	lj_assertG(isdead(g, o) || ow == LJ_GC_SFIXED,
		   "sweep of unlive string");
	lj_str_free(g, s);
	o = next;
	continue;
      }
    }
    hash = s->hash;
    if (!s->hashalg) {  /* Rehash with secondary hash. */
      hash = hash_dense(g->str.seed, hash, strdata(s), s->len);
      s->hash = hash;
      s->hashalg = 1;
    }
    /* Rechain. */
    hash &= strmask;
    u = gcrefu(strtab[hash]);
    setgcrefp(o->gch.nextgc, (u & ~(uintptr_t)1));
    setgcrefp(strtab[hash], ((uintptr_t)o | (u & 1)));
    o = next;
  }
  /* Try to insert the pending string again. */
  return lj_str_new(L, str, len);
}